

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O1

void nn_backtrace_print(void)

{
  int iVar1;
  int iVar2;
  void *frames [50];
  undefined1 auStack_1a8 [8];
  undefined1 local_1a0 [400];
  
  iVar1 = backtrace(auStack_1a8,0x32);
  if (1 < iVar1) {
    iVar2 = fileno(_stderr);
    backtrace_symbols_fd(local_1a0,iVar1 + -1,iVar2);
  }
  return;
}

Assistant:

void nn_backtrace_print (void)
{
    void *frames[50];
    int size;
    size = backtrace (frames, sizeof (frames) / sizeof (frames[0]));
    if (size > 1) {
        /*  Don't include the frame nn_backtrace_print itself. */
        backtrace_symbols_fd (&frames[1], size-1, fileno (stderr));
    }
}